

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

SizedPtr google::protobuf::internal::anon_unknown_12::AllocateBlock
                   (AllocationPolicy *policy_ptr,size_t last_size,size_t min_bytes)

{
  size_t sVar1;
  Nullable<const_char_*> failure_msg;
  ulong size;
  size_t sVar2;
  SizedPtr SVar3;
  AllocationPolicy policy;
  LogMessageFatal local_38;
  unsigned_long local_28;
  
  policy.start_block_size = 0x100;
  policy.max_block_size = 0x8000;
  policy.block_alloc = (_func_void_ptr_size_t *)0x0;
  policy.block_dealloc = (_func_void_void_ptr_size_t *)0x0;
  if (policy_ptr != (AllocationPolicy *)0x0) {
    policy.start_block_size = policy_ptr->start_block_size;
    policy.max_block_size = policy_ptr->max_block_size;
    policy.block_alloc = policy_ptr->block_alloc;
    policy.block_dealloc = policy_ptr->block_dealloc;
  }
  sVar2 = policy.max_block_size;
  sVar1 = policy.start_block_size;
  local_28 = 0xffffffffffffffef;
  local_38.super_LogMessage._0_8_ = min_bytes;
  failure_msg = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                          ((unsigned_long *)&local_38,&local_28,
                           "min_bytes <= std::numeric_limits<size_t>::max() - SerialArena::kBlockHeaderSize"
                          );
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
               ,0x4b,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_38);
  }
  if (last_size * 2 < sVar2) {
    sVar2 = last_size * 2;
  }
  if (last_size == 0) {
    sVar2 = sVar1;
  }
  size = min_bytes + 0x10;
  if (min_bytes + 0x10 < sVar2) {
    size = sVar2;
  }
  SVar3 = AllocateMemory(&policy,size);
  return SVar3;
}

Assistant:

SizedPtr AllocateBlock(const AllocationPolicy* policy_ptr, size_t last_size,
                       size_t min_bytes) {
  AllocationPolicy policy;  // default policy
  if (policy_ptr) policy = *policy_ptr;
  size_t size =
      AllocationSize(last_size, policy.start_block_size, policy.max_block_size);
  // Verify that min_bytes + kBlockHeaderSize won't overflow.
  ABSL_CHECK_LE(min_bytes, std::numeric_limits<size_t>::max() -
                               SerialArena::kBlockHeaderSize);
  size = std::max(size, SerialArena::kBlockHeaderSize + min_bytes);

  return AllocateMemory(policy, size);
}